

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O1

bool __thiscall
iutest::detail::TypedTestSuitePState::AddTestName
          (TypedTestSuitePState *this,char *file,int line,char *testsuite_name,char *test_name)

{
  char *pcVar1;
  ostream *poVar2;
  size_t sVar3;
  int line_00;
  char *local_1e0;
  string local_1d8;
  undefined1 local_1b8 [400];
  
  local_1e0 = test_name;
  if (this->m_names != (char *)0x0) {
    line_00 = 0x1aa;
    IUTestLog::IUTestLog
              ((IUTestLog *)local_1b8,LOG_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/iutest_typed_tests.hpp"
               ,0x1aa);
    FormatCompilerIndependentFileLocation_abi_cxx11_
              (&local_1d8,(detail *)file,(char *)(ulong)(uint)line,line_00);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_1b8 + 0x18),local_1d8._M_dataplus._M_p,
                        local_1d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": Test \"",8);
    pcVar1 = local_1e0;
    if (local_1e0 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar1,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"\" must be defined before IUTEST_REGISTER_TYPED_TEST_SUITE_P(",0x3c);
    if (testsuite_name == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(testsuite_name);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,testsuite_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ...).\n",8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    IUTestLog::~IUTestLog((IUTestLog *)local_1b8);
  }
  std::
  _Rb_tree<char_const*,char_const*,std::_Identity<char_const*>,std::less<char_const*>,std::allocator<char_const*>>
  ::_M_insert_unique<char_const*const&>
            ((_Rb_tree<char_const*,char_const*,std::_Identity<char_const*>,std::less<char_const*>,std::allocator<char_const*>>
              *)&this->m_list,&local_1e0);
  return true;
}

Assistant:

bool AddTestName(const char* file, int line, const char* testsuite_name, const char* test_name)
    {
        if( m_names != NULL )
        {
            IUTEST_LOG_(WARNING) << detail::FormatCompilerIndependentFileLocation(file, line)
                << ": Test \"" << test_name << "\" must be defined before IUTEST_REGISTER_TYPED_TEST_SUITE_P("
                << testsuite_name << ", ...).\n";
        }
#if IUTEST_TYPED_TEST_P_STRICT
        m_list.insert(test_name);
#endif
        return true;
    }